

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O1

FxExpression * __thiscall FxConditional::Resolve(FxConditional *this,FCompileContext *ctx)

{
  FxExpression **ppFVar1;
  BYTE BVar2;
  PPointer *pPVar3;
  PString *pPVar4;
  PType *pPVar5;
  FxConditional *pFVar6;
  int iVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  PFloat **ppPVar8;
  FxBoolCast *this_00;
  FxExpression *pFVar9;
  FxFloatCast *pFVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  FScriptPosition *other;
  PPointer *pPVar11;
  PPointer *pPVar12;
  FxConditional *pFVar13;
  bool bVar14;
  ExpVal condval;
  FString local_38;
  
  if ((this->super_FxExpression).isresolved != false) {
    return &this->super_FxExpression;
  }
  (this->super_FxExpression).isresolved = true;
  pFVar9 = this->condition;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar7 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    this->condition = (FxExpression *)CONCAT44(extraout_var,iVar7);
  }
  ppFVar1 = &this->truex;
  pFVar9 = this->truex;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar7 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_00,iVar7);
  }
  pFVar9 = this->falsex;
  if (pFVar9 != (FxExpression *)0x0) {
    iVar7 = (*pFVar9->_vptr_FxExpression[2])(pFVar9,ctx);
    this->falsex = (FxExpression *)CONCAT44(extraout_var_01,iVar7);
  }
  if (((this->condition == (FxExpression *)0x0) ||
      (pFVar9 = *ppFVar1, pFVar9 == (FxExpression *)0x0)) || (this->falsex == (FxExpression *)0x0))
  {
LAB_0052e447:
    (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
    this = (FxConditional *)0x0;
  }
  else {
    pPVar12 = (PPointer *)pFVar9->ValueType;
    if (pPVar12 != (PPointer *)this->falsex->ValueType) {
      iVar7 = (*(pPVar12->super_PBasicType).super_PType.super_PTypeBase.super_DObject._vptr_DObject
                [8])();
      if (((char)iVar7 == '\0') || (pFVar9->ValueType->RegType != '\0')) {
LAB_0052e2cd:
        iVar7 = (*((*ppFVar1)->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
        if (((char)iVar7 == '\0') ||
           (iVar7 = (*(this->falsex->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])(),
           (char)iVar7 == '\0')) {
          pPVar12 = (PPointer *)(*ppFVar1)->ValueType;
          if (((pPVar12->super_PBasicType).super_PType.RegType != '\x03') ||
             ((PPointer *)this->falsex->ValueType != TypeNullPtr)) {
            pPVar3 = (PPointer *)this->falsex->ValueType;
            pPVar11 = (PPointer *)TypeVoid;
            if (pPVar12 == TypeNullPtr) {
              pPVar11 = pPVar3;
            }
            pPVar12 = pPVar11;
            if ((pPVar3->super_PBasicType).super_PType.RegType != '\x03') {
              pPVar12 = (PPointer *)TypeVoid;
            }
          }
          goto LAB_0052e34a;
        }
        ppPVar8 = &TypeFloat64;
      }
      else {
        pFVar9 = this->falsex;
        iVar7 = (*(pFVar9->ValueType->super_PTypeBase).super_DObject._vptr_DObject[8])();
        if (((char)iVar7 == '\0') || (pFVar9->ValueType->RegType != '\0')) goto LAB_0052e2cd;
        ppPVar8 = (PFloat **)&TypeSInt32;
      }
      pPVar12 = (PPointer *)*ppPVar8;
    }
LAB_0052e34a:
    (this->super_FxExpression).ValueType = (PType *)pPVar12;
    if (this->condition->ValueType != (PType *)TypeBool) {
      this_00 = (FxBoolCast *)FMemArena::Alloc(&FxAlloc,0x38);
      pFVar9 = this->condition;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxExpression_00711370;
      FScriptPosition::FScriptPosition
                (&(this_00->super_FxExpression).ScriptPosition,&pFVar9->ScriptPosition);
      (this_00->super_FxExpression).ValueType = (PType *)0x0;
      (this_00->super_FxExpression).isresolved = false;
      (this_00->super_FxExpression).NeedResult = true;
      (this_00->super_FxExpression).ExprType = EFX_BoolCast;
      (this_00->super_FxExpression)._vptr_FxExpression = (_func_int **)&PTR__FxBoolCast_0070f548;
      this_00->basex = pFVar9;
      (this_00->super_FxExpression).ValueType = (PType *)TypeBool;
      this_00->NeedValue = true;
      this->condition = (FxExpression *)this_00;
      pFVar9 = FxBoolCast::Resolve(this_00,ctx);
      this->condition = pFVar9;
      if (pFVar9 == (FxExpression *)0x0) goto LAB_0052e447;
    }
    iVar7 = (*this->condition->_vptr_FxExpression[3])();
    if ((char)iVar7 == '\0') {
      pPVar5 = (this->super_FxExpression).ValueType;
      if ((pPVar5->RegType == '\x01') && (pPVar5->RegCount == '\x01')) {
        if ((*ppFVar1)->ValueType->RegType != '\x01') {
          pFVar10 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
          FxFloatCast::FxFloatCast(pFVar10,*ppFVar1);
          *ppFVar1 = (FxExpression *)pFVar10;
          iVar7 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
          *ppFVar1 = (FxExpression *)CONCAT44(extraout_var_02,iVar7);
        }
        if (this->falsex->ValueType->RegType != '\x01') {
          pFVar10 = (FxFloatCast *)FMemArena::Alloc(&FxAlloc,0x30);
          FxFloatCast::FxFloatCast(pFVar10,this->falsex);
          this->falsex = (FxExpression *)pFVar10;
          iVar7 = (*(pFVar10->super_FxExpression)._vptr_FxExpression[2])(pFVar10,ctx);
          this->falsex = (FxExpression *)CONCAT44(extraout_var_03,iVar7);
        }
      }
    }
    else {
      pPVar4 = (PString *)this->condition[1]._vptr_FxExpression;
      other = &this->condition[1].ScriptPosition;
      if (pPVar4 == TypeString) {
        FString::AttachToOther(&local_38,&other->FileName);
      }
      else {
        local_38.Chars = (other->FileName).Chars;
      }
      BVar2 = (pPVar4->super_PBasicType).super_PType.RegType;
      if (BVar2 == '\x01') {
        bVar14 = (double)local_38.Chars != 0.0;
      }
      else if (BVar2 == '\0') {
        bVar14 = (int)local_38.Chars != 0;
      }
      else {
        bVar14 = false;
      }
      pFVar13 = (FxConditional *)this->truex;
      pFVar6 = (FxConditional *)this->falsex;
      if (bVar14) {
        pFVar13 = (FxConditional *)this->falsex;
        pFVar6 = (FxConditional *)this->truex;
      }
      if (pFVar13 != (FxConditional *)0x0) {
        (*(pFVar13->super_FxExpression)._vptr_FxExpression[1])();
      }
      *ppFVar1 = (FxExpression *)0x0;
      this->falsex = (FxExpression *)0x0;
      (*(this->super_FxExpression)._vptr_FxExpression[1])(this);
      this = pFVar6;
      if (pPVar4 == TypeString) {
        FString::~FString(&local_38);
      }
    }
  }
  return &this->super_FxExpression;
}

Assistant:

FxExpression *FxConditional::Resolve(FCompileContext& ctx)
{
	CHECKRESOLVED();
	RESOLVE(condition, ctx);
	RESOLVE(truex, ctx);
	RESOLVE(falsex, ctx);
	ABORT(condition && truex && falsex);

	if (truex->ValueType == falsex->ValueType)
		ValueType = truex->ValueType;
	else if (truex->ValueType == TypeBool && falsex->ValueType == TypeBool)
		ValueType = TypeBool;
	else if (truex->IsInteger() && falsex->IsInteger())
		ValueType = TypeSInt32;
	else if (truex->IsNumeric() && falsex->IsNumeric())
		ValueType = TypeFloat64;
	else if (truex->IsPointer() && falsex->ValueType == TypeNullPtr)
		ValueType = truex->ValueType;
	else if (falsex->IsPointer() && truex->ValueType == TypeNullPtr)
		ValueType = falsex->ValueType;
	else
		ValueType = TypeVoid;
	//else if (truex->ValueType != falsex->ValueType)

	if (ValueType->GetRegType() == REGT_NIL)
	{
		ScriptPosition.Message(MSG_ERROR, "Incompatible types for ?: operator");
		delete this;
		return nullptr;
	}

	if (condition->ValueType != TypeBool)
	{
		condition = new FxBoolCast(condition);
		SAFE_RESOLVE(condition, ctx);
	}

	if (condition->isConstant())
	{
		ExpVal condval = static_cast<FxConstant *>(condition)->GetValue();
		bool result = condval.GetBool();

		FxExpression *e = result? truex:falsex;
		delete (result? falsex:truex);
		falsex = truex = nullptr;
		delete this;
		return e;
	}

	if (IsFloat())
	{
		if (truex->ValueType->GetRegType() != REGT_FLOAT)
		{
			truex = new FxFloatCast(truex);
			RESOLVE(truex, ctx);
		}
		if (falsex->ValueType->GetRegType() != REGT_FLOAT)
		{
			falsex = new FxFloatCast(falsex);
			RESOLVE(falsex, ctx);
		}
	}

	return this;
}